

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<SparsityPrinter>_>
::ReadOpCode(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<SparsityPrinter>_>
             *this)

{
  int iVar1;
  undefined8 *in_RDI;
  int *unaff_retaddr;
  BinaryReaderBase *in_stack_00000008;
  CStringRef in_stack_00000010;
  int opcode;
  BasicCStringRef<char> local_18;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                    ((BinaryReader<mp::internal::EndiannessConverter> *)
                     CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (0x52 < iVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"invalid opcode {}");
    BinaryReaderBase::ReportError<int>(in_stack_00000008,in_stack_00000010,unaff_retaddr);
  }
  BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
  return iVar1;
}

Assistant:

int ReadOpCode() {
    int opcode = reader_.ReadUInt();
    if (opcode > internal::MAX_OPCODE)
      reader_.ReportError("invalid opcode {}", opcode);
    reader_.ReadTillEndOfLine();
    return opcode;
  }